

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  MapKey *pMVar1;
  FieldDescriptor *field_00;
  long lVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int32 iVar7;
  uint32 uVar8;
  MapFieldBase *this;
  Descriptor *pDVar9;
  size_t sVar10;
  size_t sVar11;
  string *psVar12;
  undefined4 extraout_var;
  EnumValueDescriptor *pEVar13;
  uint64 uVar14;
  int64 iVar15;
  ulong uVar16;
  Message *pMVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Reflection *this_00;
  size_t sVar18;
  MapIterator iter;
  MapIterator end;
  MapIterator local_90;
  MapIterator local_60;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_90.iter_ = FieldDescriptor::TypeOnceInit;
    local_60.iter_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_90,
               (FieldDescriptor **)&local_60);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar4 = FieldDescriptor::is_map_message_type(field), bVar4)) {
    this = Reflection::GetMapData(this_00,message,field);
    bVar4 = MapFieldBase::IsMapValid(this);
    if (bVar4) {
      MapIterator::MapIterator(&local_90,message,field);
      MapIterator::MapIterator(&local_60,message,field);
      pDVar9 = FieldDescriptor::message_type(field);
      field_00 = *(FieldDescriptor **)(pDVar9 + 0x28);
      pDVar9 = FieldDescriptor::message_type(field);
      lVar2 = *(long *)(pDVar9 + 0x28);
      (*this->_vptr_MapFieldBase[6])(this,&local_90);
      (*this->_vptr_MapFieldBase[7])(this,&local_60);
      sVar18 = 0;
      while (iVar5 = (*(local_90.map_)->_vptr_MapFieldBase[5])(local_90.map_,&local_90,&local_60),
            (char)iVar5 == '\0') {
        sVar10 = MapKeyDataOnlyByteSize(field_00,&local_90.key_);
        sVar11 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar2 + 0x98),&local_90.value_);
        uVar6 = (int)sVar11 + (int)sVar10 + 2U | 1;
        iVar5 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar18 = sVar18 + sVar11 + sVar10 + 2 + (ulong)(iVar5 * 9 + 0x49U >> 6);
        (*(local_90.map_)->_vptr_MapFieldBase[0x12])(local_90.map_,&local_90);
      }
      MapIterator::~MapIterator(&local_60);
      MapIterator::~MapIterator(&local_90);
      return sVar18;
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    uVar6 = Reflection::FieldSize(this_00,message,field);
    sVar18 = (size_t)uVar6;
  }
  else {
    sVar18 = 1;
    if (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\0') {
      bVar4 = Reflection::HasField(this_00,message,field);
      sVar18 = (size_t)bVar4;
    }
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_90.iter_ = FieldDescriptor::TypeOnceInit;
    local_60.iter_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_90,
               (FieldDescriptor **)&local_60);
  }
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
  case 6:
  case 0x10:
    return sVar18 << 3;
  case 2:
  case 7:
  case 0xf:
    return sVar18 << 2;
  case 3:
    if (*(int *)(field + 0x3c) == 3) {
      if (sVar18 == 0) {
        return 0;
      }
      sVar11 = 0;
      sVar10 = 0;
      do {
        uVar16 = Reflection::GetRepeatedInt64(this_00,message,field,(int)sVar11);
        lVar2 = 0x3f;
        if ((uVar16 | 1) != 0) {
          for (; (uVar16 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        sVar10 = sVar10 + ((int)lVar2 * 9 + 0x49U >> 6);
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    uVar16 = Reflection::GetInt64(this_00,message,field);
    goto LAB_002ae771;
  case 4:
    if (*(int *)(field + 0x3c) == 3) {
      if (sVar18 == 0) {
        return 0;
      }
      sVar11 = 0;
      sVar10 = 0;
      do {
        uVar14 = Reflection::GetRepeatedUInt64(this_00,message,field,(int)sVar11);
        lVar2 = 0x3f;
        if ((uVar14 | 1) != 0) {
          for (; (uVar14 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        sVar10 = sVar10 + ((int)lVar2 * 9 + 0x49U >> 6);
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    uVar16 = Reflection::GetUInt64(this_00,message,field);
    goto LAB_002ae771;
  case 5:
    if (*(int *)(field + 0x3c) == 3) {
      if (sVar18 == 0) {
        return 0;
      }
      sVar11 = 0;
      sVar10 = 0;
      do {
        uVar6 = Reflection::GetRepeatedInt32(this_00,message,field,(int)sVar11);
        if ((int)uVar6 < 0) {
          uVar16 = 10;
        }
        else {
          iVar5 = 0x1f;
          if ((uVar6 | 1) != 0) {
            for (; (uVar6 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          uVar16 = (ulong)(iVar5 * 9 + 0x49U >> 6);
        }
        sVar10 = sVar10 + uVar16;
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    uVar6 = Reflection::GetInt32(this_00,message,field);
    goto LAB_002ae722;
  case 8:
    return sVar18;
  case 9:
  case 0xc:
    if (sVar18 != 0) {
      pMVar1 = &local_90.key_;
      sVar11 = 0;
      sVar10 = 0;
      do {
        local_90.map_ = (MapFieldBase *)0x0;
        local_90.key_.val_.bool_value_ = false;
        local_90.iter_ = pMVar1;
        if (*(int *)(field + 0x3c) == 3) {
          psVar12 = Reflection::GetRepeatedStringReference
                              (this_00,message,field,(int)sVar11,(string *)&local_90);
        }
        else {
          psVar12 = Reflection::GetStringReference(this_00,message,field,(string *)&local_90);
        }
        sVar3 = psVar12->_M_string_length;
        if ((MapKey *)local_90.iter_ != pMVar1) {
          operator_delete(local_90.iter_);
        }
        uVar6 = (uint)sVar3 | 1;
        iVar5 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + sVar3 + (ulong)(iVar5 * 9 + 0x49U >> 6);
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    break;
  case 10:
    if (*(int *)(field + 0x3c) != 3) {
      pMVar17 = Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0);
      iVar5 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[0xb])(pMVar17);
      return CONCAT44(extraout_var_01,iVar5);
    }
    if (sVar18 != 0) {
      sVar11 = 0;
      sVar10 = 0;
      do {
        pMVar17 = Reflection::GetRepeatedMessage(this_00,message,field,(int)sVar11);
        iVar5 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[0xb])(pMVar17);
        sVar10 = sVar10 + CONCAT44(extraout_var,iVar5);
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    break;
  case 0xb:
    if (*(int *)(field + 0x3c) != 3) {
      pMVar17 = Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0);
      uVar6 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[0xb])(pMVar17);
      iVar5 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      return (ulong)(iVar5 * 9 + 0x49U >> 6) + CONCAT44(extraout_var_02,uVar6);
    }
    if (sVar18 != 0) {
      sVar11 = 0;
      sVar10 = 0;
      do {
        pMVar17 = Reflection::GetRepeatedMessage(this_00,message,field,(int)sVar11);
        uVar6 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[0xb])(pMVar17);
        iVar5 = 0x1f;
        if ((uVar6 | 1) != 0) {
          for (; (uVar6 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + CONCAT44(extraout_var_00,uVar6) + (ulong)(iVar5 * 9 + 0x49U >> 6);
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    break;
  case 0xd:
    if (*(int *)(field + 0x3c) == 3) {
      if (sVar18 == 0) {
        return 0;
      }
      sVar11 = 0;
      sVar10 = 0;
      do {
        uVar8 = Reflection::GetRepeatedUInt32(this_00,message,field,(int)sVar11);
        iVar5 = 0x1f;
        if ((uVar8 | 1) != 0) {
          for (; (uVar8 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + (iVar5 * 9 + 0x49U >> 6);
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    uVar6 = Reflection::GetUInt32(this_00,message,field);
    goto LAB_002ae72a;
  case 0xe:
    if (*(int *)(field + 0x3c) == 3) {
      if (sVar18 == 0) {
        return 0;
      }
      sVar11 = 0;
      sVar10 = 0;
      do {
        pEVar13 = Reflection::GetRepeatedEnum(this_00,message,field,(int)sVar11);
        if ((int)*(uint *)(pEVar13 + 0x10) < 0) {
          uVar16 = 10;
        }
        else {
          uVar6 = *(uint *)(pEVar13 + 0x10) | 1;
          iVar5 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          uVar16 = (ulong)(iVar5 * 9 + 0x49U >> 6);
        }
        sVar10 = sVar10 + uVar16;
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    pEVar13 = Reflection::GetEnum(this_00,message,field);
    uVar6 = *(uint *)(pEVar13 + 0x10);
LAB_002ae722:
    if ((int)uVar6 < 0) {
      return 10;
    }
LAB_002ae72a:
    iVar5 = 0x1f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    goto LAB_002ae779;
  case 0x11:
    if (*(int *)(field + 0x3c) == 3) {
      if (sVar18 == 0) {
        return 0;
      }
      sVar11 = 0;
      sVar10 = 0;
      do {
        iVar7 = Reflection::GetRepeatedInt32(this_00,message,field,(int)sVar11);
        uVar6 = iVar7 >> 0x1f ^ iVar7 * 2 | 1;
        iVar5 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = sVar10 + (iVar5 * 9 + 0x49U >> 6);
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    iVar7 = Reflection::GetInt32(this_00,message,field);
    uVar6 = iVar7 >> 0x1f ^ iVar7 * 2 | 1;
    iVar5 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    goto LAB_002ae779;
  case 0x12:
    if (*(int *)(field + 0x3c) == 3) {
      if (sVar18 == 0) {
        return 0;
      }
      sVar11 = 0;
      sVar10 = 0;
      do {
        iVar15 = Reflection::GetRepeatedInt64(this_00,message,field,(int)sVar11);
        uVar16 = iVar15 >> 0x3f ^ iVar15 * 2 | 1;
        lVar2 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        sVar10 = sVar10 + ((int)lVar2 * 9 + 0x49U >> 6);
        sVar11 = sVar11 + 1;
      } while (sVar18 != sVar11);
      return sVar10;
    }
    iVar15 = Reflection::GetInt64(this_00,message,field);
    uVar16 = iVar15 >> 0x3f ^ iVar15 * 2;
LAB_002ae771:
    lVar2 = 0x3f;
    if ((uVar16 | 1) != 0) {
      for (; (uVar16 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar5 = (int)lVar2;
LAB_002ae779:
    return (ulong)(iVar5 * 9 + 0x49U >> 6);
  }
  return 0;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(const FieldDescriptor* field,
                                         const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE:                                        \
    if (field->is_repeated()) {                                             \
      for (int j = 0; j < count; j++) {                                     \
        data_size += WireFormatLite::TYPE_METHOD##Size(                     \
            message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                            j));            \
      }                                                                     \
    } else {                                                                \
      data_size += WireFormatLite::TYPE_METHOD##Size(                       \
          message_reflection->Get##CPPTYPE_METHOD(message, field));         \
    }                                                                       \
    break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE:                           \
    data_size += count * WireFormatLite::k##TYPE_METHOD##Size; \
    break;

    HANDLE_TYPE(INT32, Int32, Int32)
    HANDLE_TYPE(INT64, Int64, Int64)
    HANDLE_TYPE(SINT32, SInt32, Int32)
    HANDLE_TYPE(SINT64, SInt64, Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE(FIXED32, Fixed32)
    HANDLE_FIXED_TYPE(FIXED64, Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT, Float)
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP, Group, Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
              message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
            message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}